

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::FractCase::compare(FractCase *this,void **inputs,void **outputs)

{
  int numAccurateBits;
  reference pvVar1;
  ostream *poVar2;
  Hex<8UL> HVar3;
  float fVar4;
  float fVar5;
  deUint32 local_9c;
  HexFloat local_80;
  deUint32 local_7c;
  uint local_78;
  deUint32 ulpDiff_1;
  deUint32 maxUlpDiff;
  int bitsLost;
  float ref_1;
  float out0_1;
  float in0_1;
  int compNdx_1;
  float eps;
  int mantissaBits;
  HexFloat local_50;
  deUint32 local_4c;
  float local_48;
  deUint32 ulpDiff;
  float ref;
  float out0;
  float in0;
  int compNdx;
  int scalarSize;
  DataType DStack_2c;
  bool hasZeroSign;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  FractCase *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar1 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  DStack_2c = glu::VarType::getBasicType(&pvVar1->varType);
  pvVar1 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  scalarSize = glu::VarType::getPrecision(&pvVar1->varType);
  compNdx._3_1_ = supportsSignedZero(scalarSize);
  in0 = (float)glu::getDataTypeScalarSize(DStack_2c);
  if ((scalarSize == 2) || (scalarSize == 1)) {
    for (out0 = 0.0; (int)out0 < (int)in0; out0 = (float)((int)out0 + 1)) {
      ref = *(float *)((long)*outputs_local + (long)(int)out0 * 4);
      ulpDiff = *(deUint32 *)((long)*_precision + (long)(int)out0 * 4);
      local_48 = deFloatFrac(ref);
      if ((compNdx._3_1_ & 1) == 0) {
        local_9c = getUlpDiffIgnoreZeroSign((float)ulpDiff,local_48);
      }
      else {
        local_9c = getUlpDiff((float)ulpDiff,local_48);
      }
      local_4c = local_9c;
      if (local_9c != 0) {
        poVar2 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)out0);
        poVar2 = std::operator<<(poVar2,"] = ");
        HexFloat::HexFloat(&local_50,local_48);
        poVar2 = Functional::operator<<(poVar2,&local_50);
        poVar2 = std::operator<<(poVar2,", got ULP diff ");
        _eps = tcu::toHex<unsigned_int>(local_4c);
        tcu::Format::operator<<(poVar2,_eps);
        return false;
      }
    }
  }
  else {
    compNdx_1 = getMinMantissaBits(scalarSize);
    in0_1 = getEpsFromBits(1.0,compNdx_1);
    for (out0_1 = 0.0; (int)out0_1 < (int)in0; out0_1 = (float)((int)out0_1 + 1)) {
      ref_1 = *(float *)((long)*outputs_local + (long)(int)out0_1 * 4);
      bitsLost = *(int *)((long)*_precision + (long)(int)out0_1 * 4);
      fVar4 = ::deFloatFloor(ref_1 - in0_1);
      fVar5 = ::deFloatFloor(ref_1 + in0_1);
      if ((int)fVar4 == (int)fVar5) {
        maxUlpDiff = (deUint32)deFloatFrac(ref_1);
        ulpDiff_1 = numBitsLostInOp(ref_1,(float)maxUlpDiff);
        numAccurateBits = de::max<int>(0,compNdx_1 - ulpDiff_1);
        local_78 = getMaxUlpDiffFromBits(numAccurateBits);
        local_7c = getUlpDiffIgnoreZeroSign((float)bitsLost,(float)maxUlpDiff);
        if (local_78 < local_7c) {
          poVar2 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,
                                   "Expected [");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)out0_1);
          poVar2 = std::operator<<(poVar2,"] = ");
          HexFloat::HexFloat(&local_80,(float)maxUlpDiff);
          poVar2 = Functional::operator<<(poVar2,&local_80);
          poVar2 = std::operator<<(poVar2," with ULP threshold ");
          HVar3 = tcu::toHex<unsigned_int>(local_78);
          poVar2 = tcu::Format::operator<<(poVar2,HVar3);
          poVar2 = std::operator<<(poVar2,", got diff ");
          HVar3 = tcu::toHex<unsigned_int>(local_7c);
          tcu::Format::operator<<(poVar2,HVar3);
          return false;
        }
      }
      else if (1.0 <= (float)bitsLost) {
        poVar2 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)out0_1);
        std::operator<<(poVar2,"] < 1.0");
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatFrac(in0);

				const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];

				if (int(deFloatFloor(in0-eps)) == int(deFloatFloor(in0+eps)))
				{
					const float		ref			= deFloatFrac(in0);
					const int		bitsLost	= numBitsLostInOp(in0, ref);
					const deUint32	maxUlpDiff	= getMaxUlpDiffFromBits(de::max(0, mantissaBits-bitsLost));	// ULP diff for rounded integer value.
					const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, ref);

					if (ulpDiff > maxUlpDiff)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << " with ULP threshold " << tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
						return false;
					}
				}
				else
				{
					if (out0 >= 1.0f)
					{
						m_failMsg << "Expected [" << compNdx << "] < 1.0";
						return false;
					}
				}
			}
		}

		return true;
	}